

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O3

Result * validateOptimizer(Result *__return_storage_ptr__,Optimizer *optimizer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AdamOptimizer *pAVar2;
  SGDOptimizer *pSVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  DoubleParameter *pDVar7;
  Int64Parameter *pIVar8;
  string err;
  string local_c0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  CoreML::Result::Result((Result *)local_a0);
  paVar5 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar5;
  if (optimizer->_oneof_case_[0] == 10) {
    pSVar3 = (optimizer->OptimizerType_).sgdoptimizer_;
    pcVar6 = "SGD optimizer should include learningRate parameter.";
    if ((pSVar3 == (SGDOptimizer *)&CoreML::Specification::_SGDOptimizer_default_instance_) ||
       (pSVar3->learningrate_ == (DoubleParameter *)0x0)) {
LAB_00288c15:
      std::__cxx11::string::_M_replace
                ((ulong)&local_50,0,(char *)local_50._M_string_length,(ulong)pcVar6);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_50)
      ;
      goto LAB_00288c33;
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"learningRate","",
               "SGD optimizer should include learningRate parameter.",0x34);
    pDVar7 = pSVar3->learningrate_;
    if (pDVar7 == (DoubleParameter *)0x0) {
      pDVar7 = (DoubleParameter *)&CoreML::Specification::_DoubleParameter_default_instance_;
    }
    CoreML::validateDoubleParameter((Result *)local_78,&local_c0,pDVar7);
    local_a0 = local_78;
    std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    bVar4 = CoreML::Result::good((Result *)local_a0);
    if (bVar4) {
      if (pSVar3->minibatchsize_ == (Int64Parameter *)0x0) {
        pcVar6 = "SGD optimizer should include miniBatchSize parameter.";
        goto LAB_00288c15;
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"miniBatchSize","");
      pIVar8 = pSVar3->minibatchsize_;
      if (pIVar8 == (Int64Parameter *)0x0) {
        pIVar8 = (Int64Parameter *)&CoreML::Specification::_Int64Parameter_default_instance_;
      }
      CoreML::validateInt64Parameter((Result *)local_78,&local_c0,pIVar8,true);
      local_a0 = local_78;
      std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::good((Result *)local_a0);
    }
  }
  else {
    if (optimizer->_oneof_case_[0] != 0xb) {
      std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x31341a);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_50)
      ;
      goto LAB_00288c33;
    }
    pAVar2 = (optimizer->OptimizerType_).adamoptimizer_;
    pcVar6 = "ADAM optimizer should include learningRate parameter.";
    if ((pAVar2 == (AdamOptimizer *)&CoreML::Specification::_AdamOptimizer_default_instance_) ||
       (pAVar2->learningrate_ == (DoubleParameter *)0x0)) {
LAB_00288be0:
      std::__cxx11::string::_M_replace
                ((ulong)&local_50,0,(char *)local_50._M_string_length,(ulong)pcVar6);
LAB_00288bec:
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_50)
      ;
      goto LAB_00288c33;
    }
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"learningRate","",
               "ADAM optimizer should include learningRate parameter.",0x35);
    pDVar7 = pAVar2->learningrate_;
    if (pDVar7 == (DoubleParameter *)0x0) {
      pDVar7 = (DoubleParameter *)&CoreML::Specification::_DoubleParameter_default_instance_;
    }
    CoreML::validateDoubleParameter((Result *)local_78,&local_c0,pDVar7);
    local_a0 = local_78;
    std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    bVar4 = CoreML::Result::good((Result *)local_a0);
    if (bVar4) {
      if (pAVar2->minibatchsize_ == (Int64Parameter *)0x0) {
        pcVar6 = "ADAM optimizer should include miniBatchSize parameter.";
        goto LAB_00288be0;
      }
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"miniBatchSize","");
      pIVar8 = pAVar2->minibatchsize_;
      if (pIVar8 == (Int64Parameter *)0x0) {
        pIVar8 = (Int64Parameter *)&CoreML::Specification::_Int64Parameter_default_instance_;
      }
      CoreML::validateInt64Parameter((Result *)local_78,&local_c0,pIVar8,true);
      local_a0 = local_78;
      std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      bVar4 = CoreML::Result::good((Result *)local_a0);
      if (bVar4) {
        if (pAVar2->beta1_ == (DoubleParameter *)0x0) {
          pcVar6 = "ADAM optimizer should include beta1 parameter.";
LAB_00288c93:
          std::__cxx11::string::operator=((string *)&local_50,pcVar6);
          goto LAB_00288bec;
        }
        local_c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"beta1","");
        pDVar7 = pAVar2->beta1_;
        if (pDVar7 == (DoubleParameter *)0x0) {
          pDVar7 = (DoubleParameter *)&CoreML::Specification::_DoubleParameter_default_instance_;
        }
        CoreML::validateDoubleParameter((Result *)local_78,&local_c0,pDVar7);
        local_a0 = local_78;
        std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = CoreML::Result::good((Result *)local_a0);
        if (bVar4) {
          if (pAVar2->beta2_ == (DoubleParameter *)0x0) {
            pcVar6 = "ADAM optimizer should include beta2 parameter.";
            goto LAB_00288c93;
          }
          local_c0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"beta2","");
          pDVar7 = pAVar2->beta2_;
          if (pDVar7 == (DoubleParameter *)0x0) {
            pDVar7 = (DoubleParameter *)&CoreML::Specification::_DoubleParameter_default_instance_;
          }
          CoreML::validateDoubleParameter((Result *)local_78,&local_c0,pDVar7);
          local_a0 = local_78;
          std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = CoreML::Result::good((Result *)local_a0);
          if (bVar4) {
            if (pAVar2->eps_ == (DoubleParameter *)0x0) {
              pcVar6 = "ADAM optimizer should include eps (epslion) parameter.";
              goto LAB_00288c93;
            }
            local_c0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"eps","");
            pDVar7 = pAVar2->eps_;
            if (pDVar7 == (DoubleParameter *)0x0) {
              pDVar7 = (DoubleParameter *)&CoreML::Specification::_DoubleParameter_default_instance_
              ;
            }
            CoreML::validateDoubleParameter((Result *)local_78,&local_c0,pDVar7);
            local_a0 = local_78;
            std::__cxx11::string::operator=((string *)&local_98,(string *)(local_78 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_p != &local_60) {
              operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            CoreML::Result::good((Result *)local_a0);
          }
        }
      }
    }
  }
  __return_storage_ptr__->m_type = local_a0._0_4_;
  __return_storage_ptr__->m_reason = local_a0._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p == &local_88) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_98._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_90;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
LAB_00288c33:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar5) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  paVar5 = &local_88;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != paVar5) {
    operator_delete(local_98._M_p,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    paVar5 = extraout_RAX;
  }
  return (Result *)paVar5;
}

Assistant:

static Result validateOptimizer(const Specification::Optimizer& optimizer) {
    Result r;
    std::string err;
    
    switch (optimizer.OptimizerType_case()) {
        case Specification::Optimizer::kSgdOptimizer:
        {
            const Specification::SGDOptimizer &sgdOptimizer = optimizer.sgdoptimizer();
            
            if (false == sgdOptimizer.has_learningrate()) {
                err = "SGD optimizer should include learningRate parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("learningRate", sgdOptimizer.learningrate());
            if (!r.good()) {return r;}
            
            if (false == sgdOptimizer.has_minibatchsize()) {
                err = "SGD optimizer should include miniBatchSize parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateInt64Parameter("miniBatchSize", sgdOptimizer.minibatchsize(), true);
            if (!r.good()) {return r;}
            
            break;
        }
        case Specification::Optimizer::kAdamOptimizer:
        {
            const Specification::AdamOptimizer &adamOptimizer = optimizer.adamoptimizer();
            
            if (false == adamOptimizer.has_learningrate()) {
                err = "ADAM optimizer should include learningRate parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("learningRate", adamOptimizer.learningrate());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_minibatchsize()) {
                err = "ADAM optimizer should include miniBatchSize parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateInt64Parameter("miniBatchSize", adamOptimizer.minibatchsize(), true);
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_beta1()) {
                err = "ADAM optimizer should include beta1 parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("beta1", adamOptimizer.beta1());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_beta2()) {
                err = "ADAM optimizer should include beta2 parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("beta2", adamOptimizer.beta2());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_eps()) {
                err = "ADAM optimizer should include eps (epslion) parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("eps", adamOptimizer.eps());
            if (!r.good()) {return r;}
    
            break;
        }
        default:
            err = "Optimizer is not recognized.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    return r;
}